

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
ear::real_quadratic_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double a,double b,
          double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_type sVar3;
  double dVar4;
  double dVar5;
  ulong extraout_XMM0_Qb;
  ulong uVar7;
  undefined1 auVar6 [16];
  ulong in_XMM1_Qb;
  double __x;
  double dVar8;
  initializer_list<double> __l;
  allocator_type local_69;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  double local_28;
  undefined8 uStack_20;
  double local_18;
  ulong uStack_10;
  
  if (1e-10 <= ABS(c)) {
    if (ABS(a) < 1e-10) {
      local_48._8_8_ = local_48._0_8_;
      local_48._0_8_ = -c / b;
    }
    else {
      __x = b * b + a * -4.0 * c;
      if (1e-10 < __x) {
        local_18 = -b;
        uStack_10 = in_XMM1_Qb ^ 0x8000000000000000;
        dVar4 = SQRT(__x);
        uVar7 = 0;
        dVar5 = dVar4;
        local_38 = b;
        if (__x < 0.0) {
          uStack_20 = 0;
          local_68 = __x;
          uStack_60 = in_XMM1_Qb;
          local_58 = a;
          local_28 = dVar4;
          dVar4 = sqrt(__x);
          __x = local_68;
          a = local_58;
          dVar5 = local_28;
          uVar7 = extraout_XMM0_Qb;
        }
        dVar8 = a + a;
        if (__x < 0.0) {
          local_68 = dVar4;
          uStack_60 = uVar7;
          local_58 = a + a;
          dVar5 = sqrt(__x);
          dVar8 = local_58;
          dVar4 = local_68;
        }
        auVar6._0_8_ = dVar4 - local_38;
        auVar6._8_8_ = local_18 - dVar5;
        auVar1._8_8_ = dVar8;
        auVar1._0_8_ = dVar8;
        local_48 = divpd(auVar6,auVar1);
        sVar3 = 2;
        goto LAB_001351e2;
      }
      if (__x <= -1e-10) {
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      local_48._8_8_ = local_48._0_8_;
      local_48._0_8_ = -b / (a + a);
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_48._0_8_;
    local_48 = auVar2 << 0x40;
  }
  sVar3 = 1;
LAB_001351e2:
  __l._M_array = (iterator)local_48;
  __l._M_len = sVar3;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> real_quadratic_roots(double a, double b, double c) {
    double eps = 1e-10;

    if (std::abs(c) < eps) return {0.0};
    if (std::abs(a) < eps) return {-c / b};

    double det = b * b - 4.0 * a * c;
    if (det > eps)
      return {(-b + sqrt(det)) / (2.0 * a), (-b - sqrt(det)) / (2.0 * a)};
    else if (det > -eps)
      return {-b / (2.0 * a)};
    else
      return {};
  }